

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

size_t __thiscall
axl::sl::Array<Range,_axl::sl::ArrayDetails<Range>_>::insert
          (Array<Range,_axl::sl::ArrayDetails<Range>_> *this,size_t index,ValueArg e,size_t count)

{
  Range *pRVar1;
  size_t in_RCX;
  uint64_t *in_RDX;
  Array<Range,_axl::sl::ArrayDetails<Range>_> *in_RSI;
  long in_RDI;
  Range *end;
  Range *dst;
  Range *local_30;
  size_t local_8;
  
  if (in_RCX == 0) {
    local_8 = *(size_t *)(in_RDI + 0x10);
  }
  else {
    local_30 = insertSpace(in_RSI,(size_t)in_RDX,in_RCX);
    if (local_30 == (Range *)0x0) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      pRVar1 = local_30 + in_RCX;
      for (; local_30 < pRVar1; local_30 = local_30 + 1) {
        local_30->m_from = *in_RDX;
        local_30->m_to = in_RDX[1];
      }
      local_8 = *(size_t *)(in_RDI + 0x10);
    }
  }
  return local_8;
}

Assistant:

size_t
	insert(
		size_t index,
		ValueArg e,
		size_t count = 1
	) {
		if (count == 0)
			return this->m_count;

		T* dst = insertSpace(index, count);
		if (!dst)
			return -1;

		T* end = dst + count;
		for (; dst < end; dst++)
			*dst = e;

		return this->m_count;
	}